

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

Ptr __thiscall
r_comp::Preprocessor::process(Preprocessor *this,char *file,string *error,Metadata *metadata)

{
  long lVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int64_t iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Metadata *in_R8;
  Ptr PVar5;
  uint64_t b;
  uint64_t a;
  ifstream stream;
  string local_268;
  uint64_t local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  pcVar2 = DAT_0014b168;
  strlen((char *)error);
  std::__cxx11::string::_M_replace
            ((ulong)&RepliStruct::GlobalFilename_abi_cxx11_,0,pcVar2,(ulong)error);
  std::ifstream::ifstream(local_238,(char *)error,_S_in);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    RepliStruct::reset(*(RepliStruct **)file);
    lVar1 = *(long *)file;
    pcVar2 = *(char **)(lVar1 + 0x90);
    strlen((char *)error);
    std::__cxx11::string::_M_replace(lVar1 + 0x88,0,pcVar2,(ulong)error);
    local_248[1] = 0;
    local_248[0] = 0;
    iVar4 = RepliStruct::parse(*(RepliStruct **)file,(istream *)local_238,local_248 + 1,local_248,0)
    ;
    if (iVar4 < 0) {
      RepliStruct::printError_abi_cxx11_(&local_268,*(RepliStruct **)file);
      std::__cxx11::string::operator=((string *)metadata,(string *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      std::ifstream::close();
    }
    else if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      std::__cxx11::string::_M_replace
                ((ulong)metadata,0,(char *)(metadata->classes)._M_h._M_bucket_count,0x13ed7e);
      std::ifstream::close();
    }
    else {
      do {
        iVar4 = RepliStruct::process(*(RepliStruct **)file);
      } while (0 < iVar4);
      if (iVar4 < 0) {
        RepliStruct::printError_abi_cxx11_(&local_268,*(RepliStruct **)file);
        std::__cxx11::string::operator=((string *)metadata,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        std::ifstream::close();
      }
      else {
        if (in_R8 != (Metadata *)0x0) {
          initialize((Preprocessor *)file,in_R8);
        }
        RepliStruct::printError_abi_cxx11_(&local_268,*(RepliStruct **)file);
        std::__cxx11::string::operator=((string *)metadata,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p);
        }
        std::ifstream::close();
        if ((metadata->classes)._M_h._M_bucket_count == 0) {
          (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)file;
          p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(file + 8);
          (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var3;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          goto LAB_001367f3;
        }
      }
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)metadata,0,(char *)(metadata->classes)._M_h._M_bucket_count,0x13ed69);
    std::__cxx11::string::append((char *)metadata);
  }
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001367f3:
  std::ifstream::~ifstream(local_238);
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr Preprocessor::process(const char* file, std::string& error, r_comp::Metadata* metadata)
{
    RepliStruct::GlobalFilename = file;
    std::ifstream stream(file);

    if (!stream.good()) {
        error = "unable to load file ";
        error += file;
        return nullptr;
    }

    root->reset(); // trims root from previously preprocessed objects.
    root->fileName = file;
    uint64_t a = 0, b = 0;

    if (root->parse(&stream, a, b) < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (!stream.eof()) {
        error = "Code structure error: Unexpected EOF, unmatched ) or ].\n";
        stream.close();
        return nullptr;
    }

    int64_t pass = 0, total = 0, count;

    while ((count = root->process()) > 0) {
        total += count;
        pass++;
    }

    if (count < 0) {
        error = root->printError();
        stream.close();
        return nullptr;
    }

    if (metadata) {
        initialize(metadata);
    }

    error = root->printError();
    stream.close();

    if (error.size() > 0) {
        return nullptr;
    }

    return root;
}